

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintBool_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,bool val)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  
  pcVar1 = "false";
  if ((int)CONCAT71(in_register_00000011,val) != 0) {
    pcVar1 = "true";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (CONCAT71(in_register_00000011,val) & 0xffffffff ^ 5));
  return __return_storage_ptr__;
}

Assistant:

string TextFormat::FieldValuePrinter::PrintBool(bool val) const {
  return val ? "true" : "false";
}